

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasHeat2D_kry.c
# Opt level: O0

int main(void)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  void *mem_00;
  sunrealtype t;
  N_Vector uu_00;
  UserData data_00;
  undefined8 *__ptr;
  undefined8 uVar4;
  SUNContext ctx;
  SUNLinearSolver LS;
  long ncfl;
  long ncfn;
  long netf;
  sunrealtype tret;
  sunrealtype tout;
  sunrealtype t1;
  sunrealtype t0;
  sunrealtype atol;
  sunrealtype rtol;
  int iout;
  int retval;
  N_Vector res;
  N_Vector constraints;
  N_Vector up;
  N_Vector uu;
  UserData data;
  void *mem;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  char *pcVar5;
  void *in_stack_ffffffffffffff78;
  undefined8 local_80;
  undefined8 local_78;
  undefined1 local_70 [8];
  double local_68;
  double local_60;
  undefined8 local_58;
  undefined8 local_50;
  N_Vector in_stack_ffffffffffffffb8;
  N_Vector res_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined8 local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = 0;
  pcVar5 = (char *)0x0;
  uVar1 = SUNContext_Create(0,&stack0xffffffffffffff68);
  iVar2 = check_retval(in_stack_ffffffffffffff78,pcVar5,in_stack_ffffffffffffff6c);
  if (iVar2 == 0) {
    mem_00 = (void *)N_VNew_Serial(100,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                                  );
    iVar2 = check_retval(in_stack_ffffffffffffff78,pcVar5,in_stack_ffffffffffffff6c);
    if (iVar2 == 0) {
      t = (sunrealtype)N_VClone(mem_00);
      iVar2 = check_retval(in_stack_ffffffffffffff78,pcVar5,in_stack_ffffffffffffff6c);
      if (iVar2 == 0) {
        uu_00 = (N_Vector)N_VClone(mem_00);
        iVar2 = check_retval(in_stack_ffffffffffffff78,pcVar5,in_stack_ffffffffffffff6c);
        if (iVar2 == 0) {
          data_00 = (UserData)N_VClone(mem_00);
          iVar2 = check_retval(in_stack_ffffffffffffff78,pcVar5,in_stack_ffffffffffffff6c);
          if (iVar2 == 0) {
            __ptr = (undefined8 *)malloc(0x20);
            __ptr[3] = 0;
            iVar2 = check_retval(in_stack_ffffffffffffff78,pcVar5,in_stack_ffffffffffffff6c);
            if (iVar2 == 0) {
              *__ptr = 10;
              __ptr[1] = 0x3fbc71c71c71c71c;
              __ptr[2] = 1.0 / ((double)__ptr[1] * (double)__ptr[1]);
              uVar4 = N_VClone(mem_00);
              __ptr[3] = uVar4;
              iVar2 = check_retval(in_stack_ffffffffffffff78,pcVar5,in_stack_ffffffffffffff6c);
              if (iVar2 == 0) {
                SetInitialProfile(data_00,uu_00,(N_Vector)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
                                  in_stack_ffffffffffffffb8);
                N_VConst(0x3ff0000000000000,data_00);
                local_58 = 0;
                local_60 = 0.01;
                res_00 = (N_Vector)0x0;
                local_50 = 0x3f50624dd2f1a9fc;
                local_10 = IDACreate(CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
                iVar2 = check_retval(in_stack_ffffffffffffff78,pcVar5,in_stack_ffffffffffffff6c);
                if (iVar2 == 0) {
                  IDASetUserData(local_10,__ptr);
                  iVar2 = check_retval(in_stack_ffffffffffffff78,pcVar5,in_stack_ffffffffffffff6c);
                  if (iVar2 == 0) {
                    IDASetConstraints(local_10,data_00);
                    iVar2 = check_retval(in_stack_ffffffffffffff78,pcVar5,in_stack_ffffffffffffff6c)
                    ;
                    if (iVar2 == 0) {
                      N_VDestroy(data_00);
                      IDAInit(local_58,local_10,resHeat,mem_00,t);
                      iVar2 = check_retval(in_stack_ffffffffffffff78,pcVar5,
                                           in_stack_ffffffffffffff6c);
                      if (iVar2 == 0) {
                        IDASStolerances(res_00,local_50,local_10);
                        iVar2 = check_retval(in_stack_ffffffffffffff78,pcVar5,
                                             in_stack_ffffffffffffff6c);
                        if (iVar2 == 0) {
                          pcVar5 = (char *)SUNLinSol_SPGMR(mem_00,1,0,
                                                           CONCAT44(in_stack_ffffffffffffff6c,
                                                                    in_stack_ffffffffffffff68));
                          iVar2 = check_retval(in_stack_ffffffffffffff78,pcVar5,
                                               in_stack_ffffffffffffff6c);
                          if (iVar2 == 0) {
                            SUNLinSol_SPGMRSetMaxRestarts(pcVar5,5);
                            iVar2 = check_retval(in_stack_ffffffffffffff78,pcVar5,
                                                 in_stack_ffffffffffffff6c);
                            if (iVar2 == 0) {
                              IDASetLinearSolver(local_10,pcVar5,0);
                              iVar2 = check_retval(in_stack_ffffffffffffff78,pcVar5,
                                                   in_stack_ffffffffffffff6c);
                              if (iVar2 == 0) {
                                IDASetPreconditioner(local_10,PsetupHeat,PsolveHeat);
                                iVar2 = check_retval(in_stack_ffffffffffffff78,pcVar5,
                                                     in_stack_ffffffffffffff6c);
                                if (iVar2 == 0) {
                                  PrintHeader((sunrealtype)pcVar5,
                                              (sunrealtype)
                                              CONCAT44(in_stack_ffffffffffffff6c,
                                                       in_stack_ffffffffffffff68));
                                  printf("\n\nCase 1: gsytpe = SUN_MODIFIED_GS\n");
                                  printf("\n   Output Summary (umax = max-norm of solution) \n\n");
                                  printf(
                                        "  time     umax       k  nst  nni  nje   nre   nreLS    h      npe nps\n"
                                        );
                                  printf(
                                        "----------------------------------------------------------------------\n"
                                        );
                                  local_68 = local_60;
                                  for (iVar2 = 1; iVar2 < 0xc; iVar2 = iVar2 + 1) {
                                    IDASolve(local_68,local_10,local_70,mem_00,t,1);
                                    iVar3 = check_retval(in_stack_ffffffffffffff78,pcVar5,
                                                         in_stack_ffffffffffffff6c);
                                    if (iVar3 != 0) {
                                      return 1;
                                    }
                                    PrintOutput(mem_00,t,(N_Vector)data_00);
                                    local_68 = local_68 * 2.0;
                                  }
                                  IDAGetNumErrTestFails(local_10,&local_78);
                                  check_retval(in_stack_ffffffffffffff78,pcVar5,
                                               in_stack_ffffffffffffff6c);
                                  IDAGetNumNonlinSolvConvFails(local_10,&local_80);
                                  check_retval(in_stack_ffffffffffffff78,pcVar5,
                                               in_stack_ffffffffffffff6c);
                                  uVar1 = IDAGetNumLinConvFails(local_10,&stack0xffffffffffffff78);
                                  check_retval(in_stack_ffffffffffffff78,pcVar5,
                                               in_stack_ffffffffffffff6c);
                                  printf("\nError test failures            = %ld\n",local_78);
                                  printf("Nonlinear convergence failures = %ld\n",local_80);
                                  printf("Linear convergence failures    = %ld\n",
                                         in_stack_ffffffffffffff78);
                                  SetInitialProfile(data_00,uu_00,(N_Vector)CONCAT44(uVar1,iVar2),
                                                    res_00);
                                  IDAReInit(local_58,local_10,mem_00,t);
                                  iVar2 = check_retval(in_stack_ffffffffffffff78,pcVar5,
                                                       in_stack_ffffffffffffff6c);
                                  if (iVar2 == 0) {
                                    SUNLinSol_SPGMRSetGSType(pcVar5,2);
                                    iVar2 = check_retval(in_stack_ffffffffffffff78,pcVar5,
                                                         in_stack_ffffffffffffff6c);
                                    if (iVar2 == 0) {
                                      printf("\n\nCase 2: gstype = SUN_CLASSICAL_GS\n");
                                      printf(
                                            "\n   Output Summary (umax = max-norm of solution) \n\n"
                                            );
                                      printf(
                                            "  time     umax       k  nst  nni  nje   nre   nreLS    h      npe nps\n"
                                            );
                                      printf(
                                            "----------------------------------------------------------------------\n"
                                            );
                                      local_68 = local_60;
                                      for (iVar2 = 1; iVar2 < 0xc; iVar2 = iVar2 + 1) {
                                        IDASolve(local_68,local_10,local_70,mem_00,t,1);
                                        iVar3 = check_retval(in_stack_ffffffffffffff78,pcVar5,
                                                             in_stack_ffffffffffffff6c);
                                        if (iVar3 != 0) {
                                          return 1;
                                        }
                                        PrintOutput(mem_00,t,(N_Vector)data_00);
                                        local_68 = local_68 * 2.0;
                                      }
                                      IDAGetNumErrTestFails(local_10,&local_78);
                                      check_retval(in_stack_ffffffffffffff78,pcVar5,
                                                   in_stack_ffffffffffffff6c);
                                      IDAGetNumNonlinSolvConvFails(local_10,&local_80);
                                      check_retval(in_stack_ffffffffffffff78,pcVar5,
                                                   in_stack_ffffffffffffff6c);
                                      IDAGetNumLinConvFails(local_10,&stack0xffffffffffffff78);
                                      check_retval(in_stack_ffffffffffffff78,pcVar5,
                                                   in_stack_ffffffffffffff6c);
                                      printf("\nError test failures            = %ld\n",local_78);
                                      printf("Nonlinear convergence failures = %ld\n",local_80);
                                      printf("Linear convergence failures    = %ld\n",
                                             in_stack_ffffffffffffff78);
                                      IDAFree(&local_10);
                                      SUNLinSolFree(pcVar5);
                                      N_VDestroy(mem_00);
                                      N_VDestroy(t);
                                      N_VDestroy(uu_00);
                                      N_VDestroy(__ptr[3]);
                                      free(__ptr);
                                      SUNContext_Free(&stack0xffffffffffffff68);
                                      local_4 = 0;
                                    }
                                    else {
                                      local_4 = 1;
                                    }
                                  }
                                  else {
                                    local_4 = 1;
                                  }
                                }
                                else {
                                  local_4 = 1;
                                }
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  void* mem;
  UserData data;
  N_Vector uu, up, constraints, res;
  int retval, iout;
  sunrealtype rtol, atol, t0, t1, tout, tret;
  long int netf, ncfn, ncfl;
  SUNLinearSolver LS;
  SUNContext ctx;

  mem  = NULL;
  data = NULL;
  uu = up = constraints = res = NULL;
  LS                          = NULL;

  /* Create the SUNDIALS context object for this simulation */

  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Allocate N-vectors and the user data structure. */

  uu = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)uu, "N_VNew_Serial", 0)) { return (1); }

  up = N_VClone(uu);
  if (check_retval((void*)up, "N_VNew_Serial", 0)) { return (1); }

  res = N_VClone(uu);
  if (check_retval((void*)res, "N_VNew_Serial", 0)) { return (1); }

  constraints = N_VClone(uu);
  if (check_retval((void*)constraints, "N_VNew_Serial", 0)) { return (1); }

  data     = (UserData)malloc(sizeof *data);
  data->pp = NULL;
  if (check_retval((void*)data, "malloc", 2)) { return (1); }

  /* Assign parameters in the user data structure. */

  data->mm    = MGRID;
  data->dx    = ONE / (MGRID - ONE);
  data->coeff = ONE / (data->dx * data->dx);
  data->pp    = N_VClone(uu);
  if (check_retval((void*)data->pp, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize uu, up. */

  SetInitialProfile(data, uu, up, res);

  /* Set constraints to all 1's for nonnegative solution values. */

  N_VConst(ONE, constraints);

  /* Assign various parameters. */

  t0   = ZERO;
  t1   = SUN_RCONST(0.01);
  rtol = ZERO;
  atol = SUN_RCONST(1.0e-3);

  /* Call IDACreate and IDAMalloc to initialize solution */

  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDASetUserData(mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  retval = IDASetConstraints(mem, constraints);
  if (check_retval(&retval, "IDASetConstraints", 1)) { return (1); }
  N_VDestroy(constraints);

  retval = IDAInit(mem, resHeat, t0, uu, up);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  retval = IDASStolerances(mem, rtol, atol);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Create the linear solver SUNLinSol_SPGMR with left preconditioning
     and the default Krylov dimension */
  LS = SUNLinSol_SPGMR(uu, SUN_PREC_LEFT, 0, ctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* IDA recommends allowing up to 5 restarts (default is 0) */
  retval = SUNLinSol_SPGMRSetMaxRestarts(LS, 5);
  if (check_retval(&retval, "SUNLinSol_SPGMRSetMaxRestarts", 1)) { return (1); }

  /* Attach the linear sovler */
  retval = IDASetLinearSolver(mem, LS, NULL);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Set the preconditioner solve and setup functions */
  retval = IDASetPreconditioner(mem, PsetupHeat, PsolveHeat);
  if (check_retval(&retval, "IDASetPreconditioner", 1)) { return (1); }

  /* Print output heading. */
  PrintHeader(rtol, atol);

  /*
   * -------------------------------------------------------------------------
   * CASE I
   * -------------------------------------------------------------------------
   */

  /* Print case number, output table heading, and initial line of table. */

  printf("\n\nCase 1: gsytpe = SUN_MODIFIED_GS\n");
  printf("\n   Output Summary (umax = max-norm of solution) \n\n");
  printf(
    "  time     umax       k  nst  nni  nje   nre   nreLS    h      npe nps\n");
  printf(
    "----------------------------------------------------------------------\n");

  /* Loop over output times, call IDASolve, and print results. */

  for (tout = t1, iout = 1; iout <= NOUT; iout++, tout *= TWO)
  {
    retval = IDASolve(mem, tout, &tret, uu, up, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { return (1); }
    PrintOutput(mem, tret, uu);
  }

  /* Print remaining counters. */

  retval = IDAGetNumErrTestFails(mem, &netf);
  check_retval(&retval, "IDAGetNumErrTestFails", 1);

  retval = IDAGetNumNonlinSolvConvFails(mem, &ncfn);
  check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);

  retval = IDAGetNumLinConvFails(mem, &ncfl);
  check_retval(&retval, "IDAGetNumLinConvFails", 1);

  printf("\nError test failures            = %ld\n", netf);
  printf("Nonlinear convergence failures = %ld\n", ncfn);
  printf("Linear convergence failures    = %ld\n", ncfl);

  /*
   * -------------------------------------------------------------------------
   * CASE II
   * -------------------------------------------------------------------------
   */

  /* Re-initialize uu, up. */

  SetInitialProfile(data, uu, up, res);

  /* Re-initialize IDA and SPGMR */

  retval = IDAReInit(mem, t0, uu, up);
  if (check_retval(&retval, "IDAReInit", 1)) { return (1); }

  retval = SUNLinSol_SPGMRSetGSType(LS, SUN_CLASSICAL_GS);
  if (check_retval(&retval, "SUNLinSol_SPGMRSetGSType", 1)) { return (1); }

  /* Print case number, output table heading, and initial line of table. */

  printf("\n\nCase 2: gstype = SUN_CLASSICAL_GS\n");
  printf("\n   Output Summary (umax = max-norm of solution) \n\n");
  printf(
    "  time     umax       k  nst  nni  nje   nre   nreLS    h      npe nps\n");
  printf(
    "----------------------------------------------------------------------\n");

  /* Loop over output times, call IDASolve, and print results. */

  for (tout = t1, iout = 1; iout <= NOUT; iout++, tout *= TWO)
  {
    retval = IDASolve(mem, tout, &tret, uu, up, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { return (1); }
    PrintOutput(mem, tret, uu);
  }

  /* Print remaining counters. */

  retval = IDAGetNumErrTestFails(mem, &netf);
  check_retval(&retval, "IDAGetNumErrTestFails", 1);

  retval = IDAGetNumNonlinSolvConvFails(mem, &ncfn);
  check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);

  retval = IDAGetNumLinConvFails(mem, &ncfl);
  check_retval(&retval, "IDAGetNumLinConvFails", 1);

  printf("\nError test failures            = %ld\n", netf);
  printf("Nonlinear convergence failures = %ld\n", ncfn);
  printf("Linear convergence failures    = %ld\n", ncfl);

  /* Free Memory */

  IDAFree(&mem);
  SUNLinSolFree(LS);

  N_VDestroy(uu);
  N_VDestroy(up);
  N_VDestroy(res);

  N_VDestroy(data->pp);
  free(data);
  SUNContext_Free(&ctx);

  return (0);
}